

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::InsertRect
          (ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode **a_root,int a_level)

{
  bool bVar1;
  ON_RTreeNode *a_node;
  ON_RTreeBBox local_e0;
  ON_RTreeBBox local_b0;
  undefined1 local_80 [8];
  ON_RTreeBranch branch;
  ON_RTreeNode *newNode;
  ON_RTreeNode *newRoot;
  int a_level_local;
  ON_RTreeNode **a_root_local;
  ON__INT_PTR a_id_local;
  ON_RTreeBBox *a_rect_local;
  ON_RTree *this_local;
  
  bVar1 = InsertRectRec(this,a_rect,a_id,*a_root,&branch.field_1.m_child,a_level);
  if (bVar1) {
    a_node = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
    a_node->m_level = (*a_root)->m_level + 1;
    NodeCover(&local_b0,*a_root);
    memcpy(local_80,&local_b0,0x30);
    branch.m_rect.m_max[2] = (double)*a_root;
    AddBranch(this,(ON_RTreeBranch *)local_80,a_node,(ON_RTreeNode **)0x0);
    NodeCover(&local_e0,branch.field_1.m_child);
    memcpy(local_80,&local_e0,0x30);
    branch.m_rect.m_max[2] = (double)branch.field_1;
    AddBranch(this,(ON_RTreeBranch *)local_80,a_node,(ON_RTreeNode **)0x0);
    *a_root = a_node;
  }
  return bVar1;
}

Assistant:

bool ON_RTree::InsertRect(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode** a_root, int a_level)
{
  ON_RTreeNode* newRoot;
  ON_RTreeNode* newNode;
  ON_RTreeBranch branch;

  if(InsertRectRec(a_rect, a_id, *a_root, &newNode, a_level))  // Root split
  {
    newRoot = m_mem_pool.AllocNode();  // Grow tree taller and new root
    newRoot->m_level = (*a_root)->m_level + 1;
    branch.m_rect = NodeCover(*a_root);
    branch.m_child = *a_root;
    AddBranch(&branch, newRoot, nullptr);
    branch.m_rect = NodeCover(newNode);
    branch.m_child = newNode;
    AddBranch(&branch, newRoot, nullptr);
    *a_root = newRoot;
    return true;
  }

  return false;
}